

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deStringUtil.cpp
# Opt level: O2

void de::StringUtil_selfTest(void)

{
  bool bVar1;
  char cVar2;
  int precision;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x2a;
  toString<int>(&local_58,(int *)&tokens);
  bVar1 = std::operator==(&local_58,"42");
  std::__cxx11::string::~string((string *)&local_58);
  if (!bVar1) {
    deAssertFail("toString(42) == \"42\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xa1);
  }
  toString<char[4]>(&local_58,(char (*) [4])0x1921454);
  bVar1 = std::operator==(&local_58,"foo");
  std::__cxx11::string::~string((string *)&local_58);
  if (!bVar1) {
    deAssertFail("toString(\"foo\") == \"foo\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xa2);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&tokens,"FooBar",&local_5a);
  toLower(&local_58,(string *)&tokens);
  bVar1 = std::operator==(&local_58,"foobar");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&tokens);
  if (!bVar1) {
    deAssertFail("toLower(\"FooBar\") == \"foobar\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xa3);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&tokens,"FooBar",&local_5a);
  toUpper(&local_58,(string *)&tokens);
  bVar1 = std::operator==(&local_58,"FOOBAR");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&tokens);
  if (!bVar1) {
    deAssertFail("toUpper(\"FooBar\") == \"FOOBAR\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xa4);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58," foo bar\n\tbaz   ",&local_5a);
  splitString(&tokens,&local_58,'\0');
  std::__cxx11::string::~string((string *)&local_58);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(tokens.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                   tokens.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_4_);
  if ((long)tokens.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)__lhs != 0x60) {
    deAssertFail("tokens.size() == 3",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xa8);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(tokens.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                     tokens.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start._0_4_);
  }
  bVar1 = std::operator==(__lhs,"foo");
  if (!bVar1) {
    deAssertFail("tokens[0] == \"foo\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xa9);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (CONCAT44(tokens.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    tokens.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_) + 0x20),"bar");
  if (!bVar1) {
    deAssertFail("tokens[1] == \"bar\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xaa);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (CONCAT44(tokens.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    tokens.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_) + 0x40),"baz");
  if (!bVar1) {
    deAssertFail("tokens[2] == \"baz\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xab);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tokens);
  floatToString_abi_cxx11_(&local_58,(de *)&DAT_00000001,4.0,precision);
  bVar1 = std::operator==(&local_58,"4.0");
  std::__cxx11::string::~string((string *)&local_58);
  if (!bVar1) {
    deAssertFail("floatToString(4, 1) == \"4.0\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xae);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"foobar",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tokens,"foobar",&local_59);
  bVar1 = beginsWith(&local_58,(string *)&tokens);
  std::__cxx11::string::~string((string *)&tokens);
  std::__cxx11::string::~string((string *)&local_58);
  if (!bVar1) {
    deAssertFail("beginsWith(\"foobar\", \"foobar\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xb0);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"foobar",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tokens,"foo",&local_59);
  bVar1 = beginsWith(&local_58,(string *)&tokens);
  std::__cxx11::string::~string((string *)&tokens);
  std::__cxx11::string::~string((string *)&local_58);
  if (!bVar1) {
    deAssertFail("beginsWith(\"foobar\", \"foo\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xb1);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"foobar",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tokens,"f",&local_59);
  bVar1 = beginsWith(&local_58,(string *)&tokens);
  std::__cxx11::string::~string((string *)&tokens);
  std::__cxx11::string::~string((string *)&local_58);
  if (!bVar1) {
    deAssertFail("beginsWith(\"foobar\", \"f\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xb2);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"foobar",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tokens,glcts::fixed_sample_locations_values + 1,&local_59);
  bVar1 = beginsWith(&local_58,(string *)&tokens);
  std::__cxx11::string::~string((string *)&tokens);
  std::__cxx11::string::~string((string *)&local_58);
  if (!bVar1) {
    deAssertFail("beginsWith(\"foobar\", \"\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xb3);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,glcts::fixed_sample_locations_values + 1,&local_5a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tokens,glcts::fixed_sample_locations_values + 1,&local_59);
  bVar1 = beginsWith(&local_58,(string *)&tokens);
  std::__cxx11::string::~string((string *)&tokens);
  std::__cxx11::string::~string((string *)&local_58);
  if (!bVar1) {
    deAssertFail("beginsWith(\"\", \"\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xb4);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"foobar",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tokens,"bar",&local_59);
  bVar1 = beginsWith(&local_58,(string *)&tokens);
  std::__cxx11::string::~string((string *)&tokens);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    deAssertFail("!beginsWith(\"foobar\", \"bar\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xb5);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"foobar",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tokens,"foobarbaz",&local_59);
  bVar1 = beginsWith(&local_58,(string *)&tokens);
  std::__cxx11::string::~string((string *)&tokens);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    deAssertFail("!beginsWith(\"foobar\", \"foobarbaz\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xb6);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,glcts::fixed_sample_locations_values + 1,&local_5a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tokens,"foo",&local_59);
  bVar1 = beginsWith(&local_58,(string *)&tokens);
  std::__cxx11::string::~string((string *)&tokens);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    deAssertFail("!beginsWith(\"\", \"foo\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xb7);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"foobar",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tokens,"foobar",&local_59);
  bVar1 = endsWith(&local_58,(string *)&tokens);
  std::__cxx11::string::~string((string *)&tokens);
  std::__cxx11::string::~string((string *)&local_58);
  if (!bVar1) {
    deAssertFail("endsWith(\"foobar\", \"foobar\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xb9);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"foobar",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tokens,"bar",&local_59);
  bVar1 = endsWith(&local_58,(string *)&tokens);
  std::__cxx11::string::~string((string *)&tokens);
  std::__cxx11::string::~string((string *)&local_58);
  if (!bVar1) {
    deAssertFail("endsWith(\"foobar\", \"bar\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xba);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"foobar",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tokens,"r",&local_59);
  bVar1 = endsWith(&local_58,(string *)&tokens);
  std::__cxx11::string::~string((string *)&tokens);
  std::__cxx11::string::~string((string *)&local_58);
  if (!bVar1) {
    deAssertFail("endsWith(\"foobar\", \"r\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xbb);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"foobar",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tokens,glcts::fixed_sample_locations_values + 1,&local_59);
  bVar1 = endsWith(&local_58,(string *)&tokens);
  std::__cxx11::string::~string((string *)&tokens);
  std::__cxx11::string::~string((string *)&local_58);
  if (!bVar1) {
    deAssertFail("endsWith(\"foobar\", \"\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xbc);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,glcts::fixed_sample_locations_values + 1,&local_5a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tokens,glcts::fixed_sample_locations_values + 1,&local_59);
  bVar1 = endsWith(&local_58,(string *)&tokens);
  std::__cxx11::string::~string((string *)&tokens);
  std::__cxx11::string::~string((string *)&local_58);
  if (!bVar1) {
    deAssertFail("endsWith(\"\", \"\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xbd);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"foobar",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tokens,"foo",&local_59);
  bVar1 = endsWith(&local_58,(string *)&tokens);
  std::__cxx11::string::~string((string *)&tokens);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    deAssertFail("!endsWith(\"foobar\", \"foo\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xbe);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"foobar",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tokens,"bazfoobar",&local_59);
  bVar1 = endsWith(&local_58,(string *)&tokens);
  std::__cxx11::string::~string((string *)&tokens);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    deAssertFail("!endsWith(\"foobar\", \"bazfoobar\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xbf);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"foobar",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tokens,"foobarbaz",&local_59);
  bVar1 = endsWith(&local_58,(string *)&tokens);
  std::__cxx11::string::~string((string *)&tokens);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    deAssertFail("!endsWith(\"foobar\", \"foobarbaz\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xc0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,glcts::fixed_sample_locations_values + 1,&local_5a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tokens,"foo",&local_59);
  bVar1 = endsWith(&local_58,(string *)&tokens);
  std::__cxx11::string::~string((string *)&tokens);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    deAssertFail("!endsWith(\"\", \"foo\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xc1);
  }
  cVar2 = toUpper('a');
  if (cVar2 != 'A') {
    deAssertFail("toUpper(\'a\') == \'A\'",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xc3);
  }
  cVar2 = toUpper('A');
  if (cVar2 != 'A') {
    deAssertFail("toUpper(\'A\') == \'A\'",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xc4);
  }
  cVar2 = toLower('a');
  if (cVar2 != 'a') {
    deAssertFail("toLower(\'a\') == \'a\'",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xc5);
  }
  cVar2 = toLower('A');
  if (cVar2 != 'a') {
    deAssertFail("toLower(\'A\') == \'a\'",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xc6);
  }
  bVar1 = isUpper('A');
  if (!bVar1) {
    deAssertFail("isUpper(\'A\')",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,199);
  }
  bVar1 = isUpper('a');
  if (bVar1) {
    deAssertFail("!isUpper(\'a\')",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,200);
  }
  bVar1 = isLower('a');
  if (!bVar1) {
    deAssertFail("isLower(\'a\')",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xc9);
  }
  bVar1 = isLower('A');
  if (bVar1) {
    deAssertFail("!isLower(\'A\')",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xca);
  }
  bVar1 = isDigit('0');
  if (!bVar1) {
    deAssertFail("isDigit(\'0\')",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xcb);
  }
  bVar1 = isDigit('a');
  if (bVar1) {
    deAssertFail("!isDigit(\'a\')",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                 ,0xcc);
  }
  return;
}

Assistant:

void StringUtil_selfTest (void)
{

	DE_TEST_ASSERT(toString(42) == "42");
	DE_TEST_ASSERT(toString("foo") == "foo");
	DE_TEST_ASSERT(toLower("FooBar") == "foobar");
	DE_TEST_ASSERT(toUpper("FooBar") == "FOOBAR");

	{
		vector <string> tokens(splitString(" foo bar\n\tbaz   "));
		DE_TEST_ASSERT(tokens.size() == 3);
		DE_TEST_ASSERT(tokens[0] == "foo");
		DE_TEST_ASSERT(tokens[1] == "bar");
		DE_TEST_ASSERT(tokens[2] == "baz");
	}

	DE_TEST_ASSERT(floatToString(4, 1) == "4.0");

	DE_TEST_ASSERT(beginsWith("foobar", "foobar"));
	DE_TEST_ASSERT(beginsWith("foobar", "foo"));
	DE_TEST_ASSERT(beginsWith("foobar", "f"));
	DE_TEST_ASSERT(beginsWith("foobar", ""));
	DE_TEST_ASSERT(beginsWith("", ""));
	DE_TEST_ASSERT(!beginsWith("foobar", "bar"));
	DE_TEST_ASSERT(!beginsWith("foobar", "foobarbaz"));
	DE_TEST_ASSERT(!beginsWith("", "foo"));

	DE_TEST_ASSERT(endsWith("foobar", "foobar"));
	DE_TEST_ASSERT(endsWith("foobar", "bar"));
	DE_TEST_ASSERT(endsWith("foobar", "r"));
	DE_TEST_ASSERT(endsWith("foobar", ""));
	DE_TEST_ASSERT(endsWith("", ""));
	DE_TEST_ASSERT(!endsWith("foobar", "foo"));
	DE_TEST_ASSERT(!endsWith("foobar", "bazfoobar"));
	DE_TEST_ASSERT(!endsWith("foobar", "foobarbaz"));
	DE_TEST_ASSERT(!endsWith("", "foo"));

	DE_TEST_ASSERT(toUpper('a') == 'A');
	DE_TEST_ASSERT(toUpper('A') == 'A');
	DE_TEST_ASSERT(toLower('a') == 'a');
	DE_TEST_ASSERT(toLower('A') == 'a');
	DE_TEST_ASSERT(isUpper('A'));
	DE_TEST_ASSERT(!isUpper('a'));
	DE_TEST_ASSERT(isLower('a'));
	DE_TEST_ASSERT(!isLower('A'));
	DE_TEST_ASSERT(isDigit('0'));
	DE_TEST_ASSERT(!isDigit('a'));
}